

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O3

void __thiscall QWidgetResizeHandler::keyPressEvent(QWidgetResizeHandler *this,QKeyEvent *e)

{
  QWidget *this_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int extraout_var;
  int extraout_EDX;
  int extraout_var_00;
  MousePosition m;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QCursor QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((byte)this[0x40] & 2) == 0) || (*(int *)(this + 0x30) == 9)) goto switchD_0046d632_default;
  uVar1 = QKeyEvent::modifiers();
  iVar4 = 1;
  if ((uVar1 >> 0x1a & 1) == 0) {
    iVar4 = 8;
  }
  uVar3 = QCursor::pos();
  uVar1 = (uint)uVar3;
  iVar5 = (int)(uVar3 >> 0x20);
  iVar2 = *(int *)(e + 0x40);
  if (iVar2 < 0x1000012) {
    if (((1 < iVar2 + 0xfefffffcU) && (iVar2 != 0x20)) && (iVar2 != 0x1000000))
    goto switchD_0046d632_default;
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfd);
    QWidget::releaseMouse(*(QWidget **)(this + 0x10));
    QWidget::releaseKeyboard(*(QWidget **)(this + 0x10));
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
  }
  else {
    switch(iVar2) {
    case 0x1000012:
      uVar1 = uVar1 - iVar4;
      uVar3 = (ulong)uVar1;
      QGuiApplication::primaryScreen();
      iVar2 = QScreen::virtualGeometry();
      m = *(MousePosition *)(this + 0x30);
      if ((int)uVar1 <= iVar2) {
        if ((m | BottomRight) == BottomLeft) {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + iVar4;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) + iVar4;
        }
        else {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) - iVar4;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) - iVar4;
        }
      }
      if (((m != Center & (byte)this[0x40] >> 1) == 1) && (resizeHorizontalDirectionFixed == '\0'))
      {
        resizeHorizontalDirectionFixed = '\x01';
        if (m == BottomRight) {
LAB_0046d7b0:
          m = BottomLeft;
          goto LAB_0046d849;
        }
        if (m == TopRight) goto LAB_0046d844;
LAB_0046d84d:
        uVar1 = (uint)uVar3;
        setMouseCursor(this,m);
        this_00 = *(QWidget **)(this + 0x10);
        QWidget::cursor((QWidget *)&QStack_38);
        QWidget::grabMouse(this_00,&QStack_38);
        QCursor::~QCursor(&QStack_38);
      }
      break;
    case 0x1000013:
      iVar5 = iVar5 - iVar4;
      QGuiApplication::primaryScreen();
      QScreen::virtualGeometry();
      m = *(MousePosition *)(this + 0x30);
      if (iVar5 <= extraout_var) {
        if ((m == TopRight) || (m == TopLeft)) {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) + iVar4;
          *(int *)(this + 0x2c) = *(int *)(this + 0x2c) + iVar4;
        }
        else {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) - iVar4;
          *(int *)(this + 0x2c) = *(int *)(this + 0x2c) - iVar4;
        }
      }
      if (((m != Center & (byte)this[0x40] >> 1) == 1) && (resizeVerticalDirectionFixed == '\0')) {
        resizeVerticalDirectionFixed = '\x01';
        if (m == BottomLeft) {
LAB_0046d844:
          m = TopLeft;
        }
        else {
          if (m != BottomRight) goto LAB_0046d84d;
LAB_0046d83d:
          m = TopRight;
        }
LAB_0046d849:
        *(MousePosition *)(this + 0x30) = m;
        goto LAB_0046d84d;
      }
      break;
    case 0x1000014:
      uVar1 = uVar1 + iVar4;
      uVar3 = (ulong)uVar1;
      QGuiApplication::primaryScreen();
      QScreen::virtualGeometry();
      m = *(MousePosition *)(this + 0x30);
      if (extraout_EDX <= (int)uVar1) {
        if ((m == TopRight) || (m == BottomRight)) {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + iVar4;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) + iVar4;
        }
        else {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) - iVar4;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) - iVar4;
        }
      }
      if (((m != Center & (byte)this[0x40] >> 1) == 1) && (resizeHorizontalDirectionFixed == '\0'))
      {
        resizeHorizontalDirectionFixed = '\x01';
        if (m == BottomLeft) {
LAB_0046d7f9:
          m = BottomRight;
          goto LAB_0046d849;
        }
        if (m == TopLeft) goto LAB_0046d83d;
        goto LAB_0046d84d;
      }
      break;
    case 0x1000015:
      iVar5 = iVar5 + iVar4;
      QGuiApplication::primaryScreen();
      QScreen::virtualGeometry();
      m = *(MousePosition *)(this + 0x30);
      if (extraout_var_00 <= iVar5) {
        if ((m & ~TopLeft) == BottomRight) {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) + iVar4;
          iVar4 = iVar4 + *(int *)(this + 0x2c);
        }
        else {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) - iVar4;
          iVar4 = *(int *)(this + 0x2c) - iVar4;
        }
        *(int *)(this + 0x2c) = iVar4;
      }
      if (((m != Center & (byte)this[0x40] >> 1) == 1) && (resizeVerticalDirectionFixed == '\0')) {
        resizeVerticalDirectionFixed = '\x01';
        if (m == TopLeft) goto LAB_0046d7b0;
        if (m == TopRight) goto LAB_0046d7f9;
        goto LAB_0046d84d;
      }
      break;
    default:
      goto switchD_0046d632_default;
    }
  }
  QCursor::setPos(uVar1,iVar5);
switchD_0046d632_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::keyPressEvent(QKeyEvent * e)
{
    if (!isResizing())
        return;
    bool is_control = e->modifiers() & Qt::ControlModifier;
    int delta = is_control?1:8;
    QPoint pos = QCursor::pos();
    switch (e->key()) {
    case Qt::Key_Left:
        pos.rx() -= delta;
        if (pos.x() <= QGuiApplication::primaryScreen()->virtualGeometry().left()) {
            if (mode == TopLeft || mode == BottomLeft) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomRight)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = TopLeft;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Right:
        pos.rx() += delta;
        if (pos.x() >= QGuiApplication::primaryScreen()->virtualGeometry().right()) {
            if (mode == TopRight || mode == BottomRight) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = BottomRight;
            else if (mode == TopLeft)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Up:
        pos.ry() -= delta;
        if (pos.y() <= QGuiApplication::primaryScreen()->virtualGeometry().top()) {
            if (mode == TopLeft || mode == TopRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = TopLeft;
            else if (mode == BottomRight)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Down:
        pos.ry() += delta;
        if (pos.y() >= QGuiApplication::primaryScreen()->virtualGeometry().bottom()) {
            if (mode == BottomLeft || mode == BottomRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == TopLeft)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = BottomRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Space:
    case Qt::Key_Return:
    case Qt::Key_Enter:
    case Qt::Key_Escape:
        active = false;
        widget->releaseMouse();
        widget->releaseKeyboard();
        buttonDown = false;
        break;
    default:
        return;
    }
    QCursor::setPos(pos);
}